

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  fd_set *in_RCX;
  fd_set *__writefds;
  Hosts *__readfds;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  timeval *in_R8;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = (int)&bStack_b8;
  pbVar4 = &bStack_b8;
  configDir_abi_cxx11_();
  std::operator+(&local_38,&bStack_b8,"/config");
  readConfig(&local_38,&config);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_b8);
  configDir_abi_cxx11_();
  std::operator+(&local_58,&bStack_b8,"/hosts");
  __readfds = &hosts;
  readHosts(&local_58,&hosts);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_b8);
  if (argc == 2) {
    std::__cxx11::string::string((string *)&bStack_b8,argv[1],(allocator *)&local_98);
    bVar1 = std::operator==(&bStack_b8,"key");
    if (bVar1) {
      changeConfig();
      pbVar4 = &bStack_b8;
    }
    else {
      bVar1 = std::operator==(&bStack_b8,"config");
      if (bVar1) {
        configDir_abi_cxx11_();
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
        std::endl<char,std::char_traits<char>>(poVar3);
        pbVar4 = &local_98;
      }
      else {
        bVar1 = std::operator==(&bStack_b8,"hosts");
        if (!bVar1) goto LAB_001043bd;
        hostsPath_abi_cxx11_();
        editFile(&local_78);
        pbVar4 = &local_78;
      }
      std::__cxx11::string::~string((string *)pbVar4);
      pbVar4 = &bStack_b8;
    }
  }
  else {
    if (hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      display();
      iVar2 = select(iVar2,(fd_set *)__readfds,__writefds,in_RCX,in_R8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&bStack_b8);
      _Unwind_Resume(iVar2);
    }
    configDir_abi_cxx11_();
    std::operator+(&bStack_b8,&local_98,"/hosts is empty");
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&bStack_b8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&bStack_b8);
    pbVar4 = &local_98;
  }
LAB_001043bd:
  std::__cxx11::string::~string((string *)pbVar4);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    readConfig(configDir() + "/config", config);
    readHosts(configDir() + "/hosts", hosts);
    if (argc == 2) {
        std::string command = argv[1];
        if (command == "key") {
            changeConfig();
        } else if (command == "config") {
            std::cout << configDir() << std::endl;
        } else if (command == "hosts") {
            editFile(hostsPath());
        }
        return 0;
    }
    if (hosts.empty()) {
        std::cout << configDir() + "/hosts is empty" << std::endl;
        return 0;
    }
    display();
    select();
    return 0;
}